

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_seed_tests.cpp
# Opt level: O0

void __thiscall iu_Foo_x_iutest_x_Bar_Test::Body(iu_Foo_x_iutest_x_Bar_Test *this)

{
  bool bVar1;
  UnitTest *pUVar2;
  char *pcVar3;
  AssertionHelper local_3f8;
  Fixed local_3c8;
  uint local_23c;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  uint local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Foo_x_iutest_x_Bar_Test *this_local;
  
  iutest_ar._32_8_ = this;
  if (seed == 0) {
    iutest::detail::AlwaysZero();
    pUVar2 = iutest::UnitTest::GetInstance();
    local_3c = iutest::UnitTest::random_seed(pUVar2);
    iutest::internal::backward::EqHelper<false>::Compare<unsigned_int>
              ((AssertionResult *)local_38,"kSeed",
               "::iutest::UnitTest::GetInstance()->random_seed()",&kSeed,&local_3c);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (!bVar1) {
      memset(&local_1d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_38);
      iutest::AssertionHelper::AssertionHelper
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
                 ,0x24,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_208,&local_1d8);
      iutest::AssertionHelper::~AssertionHelper(&local_208);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  }
  else {
    iutest::detail::AlwaysZero();
    pUVar2 = iutest::UnitTest::GetInstance();
    local_23c = iutest::UnitTest::random_seed(pUVar2);
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_int>
              ((AssertionResult *)local_238,"seed",
               "::iutest::UnitTest::GetInstance()->random_seed()",&seed,&local_23c);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
                 ,0x28,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_3f8,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper(&local_3f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  }
  return;
}

Assistant:

IUTEST(Foo, Bar)
{
    if( seed == 0 )
    {
        IUTEST_ASSERT_EQ(kSeed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
    else
    {
        IUTEST_ASSERT_NE(seed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
}